

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O0

void __thiscall QOpenGLWindowPrivate::initialize(QOpenGLWindowPrivate *this)

{
  bool bVar1;
  QOpenGLWindow *pQVar2;
  long lVar3;
  QOpenGLContext *pQVar4;
  ulong uVar5;
  QOpenGLWindowPaintDevice *other;
  QOpenGLWindowPaintDevice *this_00;
  QOpenGLWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QOpenGLWindow *q;
  char *in_stack_ffffffffffffff38;
  QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_> *window
  ;
  QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_> *in_stack_ffffffffffffff40;
  int line;
  QOpenGLContext *in_stack_ffffffffffffff48;
  QMessageLogger *in_stack_ffffffffffffff50;
  QOpenGLWindow *this_01;
  char local_70 [32];
  char local_50 [32];
  QSurfaceFormat local_30 [8];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar1 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_> *)
                     0x1b5906);
  if (!bVar1) {
    lVar3 = QWindow::handle();
    if (lVar3 == 0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38);
      QMessageLogger::warning
                (local_28,"Attempted to initialize QOpenGLWindow without a platform window");
    }
    pQVar4 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(pQVar4,(QObject *)0x0);
    QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::reset
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    line = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    pQVar4 = QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
                       (&in_RDI->context);
    QOpenGLContext::setShareContext(pQVar4);
    pQVar4 = QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
                       (&in_RDI->context);
    QWindow::requestedFormat();
    QOpenGLContext::setFormat((QSurfaceFormat *)pQVar4);
    QSurfaceFormat::~QSurfaceFormat(local_30);
    QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
              (&in_RDI->context);
    uVar5 = QOpenGLContext::create();
    if ((uVar5 & 1) == 0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,line,
                 in_stack_ffffffffffffff38);
      QMessageLogger::warning(local_50,"QOpenGLWindow::beginPaint: Failed to create context");
    }
    other = (QOpenGLWindowPaintDevice *)
            QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
                      (&in_RDI->context);
    this_01 = pQVar2;
    uVar5 = QOpenGLContext::makeCurrent((QSurface *)other);
    if ((uVar5 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_01,(char *)other,line,in_stack_ffffffffffffff38);
      QMessageLogger::warning(local_70,"QOpenGLWindow::beginPaint: Failed to make context current");
    }
    window = &in_RDI->paintDevice;
    this_00 = (QOpenGLWindowPaintDevice *)operator_new(0x20);
    QOpenGLWindowPaintDevice::QOpenGLWindowPaintDevice(this_00,(QOpenGLWindow *)window);
    QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>::
    reset((QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>
           *)this_00,other);
    if (in_RDI->updateBehavior == PartialUpdateBlit) {
      bVar1 = QOpenGLFramebufferObject::hasOpenGLFramebufferBlit();
      in_RDI->hasFboBlit = bVar1;
    }
    (**(code **)(*(long *)pQVar2 + 0x138))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLWindowPrivate::initialize()
{
    Q_Q(QOpenGLWindow);

    if (context)
        return;

    if (!q->handle())
        qWarning("Attempted to initialize QOpenGLWindow without a platform window");

    context.reset(new QOpenGLContext);
    context->setShareContext(shareContext);
    context->setFormat(q->requestedFormat());
    if (!context->create())
        qWarning("QOpenGLWindow::beginPaint: Failed to create context");
    if (!context->makeCurrent(q))
        qWarning("QOpenGLWindow::beginPaint: Failed to make context current");

    paintDevice.reset(new QOpenGLWindowPaintDevice(q));
    if (updateBehavior == QOpenGLWindow::PartialUpdateBlit)
        hasFboBlit = QOpenGLFramebufferObject::hasOpenGLFramebufferBlit();

    q->initializeGL();
}